

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ARGBAttenuateRow_SSSE3(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uvec8 auVar6;
  uvec8 auVar7;
  int iVar8;
  ushort uVar9;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ushort uVar18;
  ushort uVar19;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  undefined1 auVar20 [16];
  ushort uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  auVar7 = libyuv::kShuffleAlpha1;
  auVar6 = libyuv::kShuffleAlpha0;
  do {
    auVar10 = pshufb(*(undefined1 (*) [16])src_argb,(undefined1  [16])auVar6);
    auVar11 = *(undefined1 (*) [16])src_argb;
    auVar27._0_14_ = auVar11._0_14_;
    auVar27[0xe] = auVar11[7];
    auVar27[0xf] = auVar11[7];
    auVar26._14_2_ = auVar27._14_2_;
    auVar26._0_13_ = auVar11._0_13_;
    auVar26[0xd] = auVar11[6];
    auVar25._13_3_ = auVar26._13_3_;
    auVar25._0_12_ = auVar11._0_12_;
    auVar25[0xc] = auVar11[6];
    auVar24._12_4_ = auVar25._12_4_;
    auVar24._0_11_ = auVar11._0_11_;
    auVar24[0xb] = auVar11[5];
    auVar23._11_5_ = auVar24._11_5_;
    auVar23._0_10_ = auVar11._0_10_;
    auVar23[10] = auVar11[5];
    auVar22._10_6_ = auVar23._10_6_;
    auVar22._0_9_ = auVar11._0_9_;
    auVar22[9] = auVar11[4];
    auVar21._9_7_ = auVar22._9_7_;
    auVar21._0_8_ = auVar11._0_8_;
    auVar21[8] = auVar11[4];
    auVar20._8_8_ = auVar21._8_8_;
    auVar20[7] = auVar11[3];
    auVar20[6] = auVar11[3];
    auVar20[5] = auVar11[2];
    auVar20[4] = auVar11[2];
    auVar20[3] = auVar11[1];
    auVar20[2] = auVar11[1];
    auVar20[0] = auVar11[0];
    auVar20[1] = auVar20[0];
    auVar11 = pmulhuw(auVar10,auVar20);
    auVar10 = pshufb(*(undefined1 (*) [16])src_argb,(undefined1  [16])auVar7);
    auVar35[1] = (*(undefined1 (*) [16])src_argb)[8];
    auVar35[0] = (*(undefined1 (*) [16])src_argb)[8];
    auVar35[2] = (*(undefined1 (*) [16])src_argb)[9];
    auVar35[3] = (*(undefined1 (*) [16])src_argb)[9];
    auVar35[4] = (*(undefined1 (*) [16])src_argb)[10];
    auVar35[5] = (*(undefined1 (*) [16])src_argb)[10];
    auVar35[6] = (*(undefined1 (*) [16])src_argb)[0xb];
    auVar35[7] = (*(undefined1 (*) [16])src_argb)[0xb];
    auVar35[8] = (*(undefined1 (*) [16])src_argb)[0xc];
    auVar35[9] = (*(undefined1 (*) [16])src_argb)[0xc];
    auVar35[10] = (*(undefined1 (*) [16])src_argb)[0xd];
    auVar35[0xb] = (*(undefined1 (*) [16])src_argb)[0xd];
    auVar35[0xc] = (*(undefined1 (*) [16])src_argb)[0xe];
    auVar35[0xd] = (*(undefined1 (*) [16])src_argb)[0xe];
    auVar35[0xe] = (*(undefined1 (*) [16])src_argb)[0xf];
    auVar35[0xf] = (*(undefined1 (*) [16])src_argb)[0xf];
    auVar10 = pmulhuw(auVar10,auVar35);
    bVar2 = (*(undefined1 (*) [16])src_argb)[3];
    bVar3 = (*(undefined1 (*) [16])src_argb)[7];
    bVar4 = (*(undefined1 (*) [16])src_argb)[0xb];
    bVar5 = (*(undefined1 (*) [16])src_argb)[0xf];
    src_argb = (uint8_t *)((long)src_argb + 0x10);
    uVar9 = auVar11._0_2_ >> 8;
    uVar12 = auVar11._2_2_ >> 8;
    uVar13 = auVar11._4_2_ >> 8;
    uVar14 = auVar11._6_2_ >> 8;
    uVar15 = auVar11._8_2_ >> 8;
    uVar16 = auVar11._10_2_ >> 8;
    uVar17 = auVar11._12_2_ >> 8;
    uVar18 = auVar11._14_2_ >> 8;
    uVar19 = auVar10._0_2_ >> 8;
    uVar28 = auVar10._2_2_ >> 8;
    uVar29 = auVar10._4_2_ >> 8;
    uVar30 = auVar10._6_2_ >> 8;
    uVar31 = auVar10._8_2_ >> 8;
    uVar32 = auVar10._10_2_ >> 8;
    uVar33 = auVar10._12_2_ >> 8;
    uVar34 = auVar10._14_2_ >> 8;
    *dst_argb = (uVar9 != 0) * (uVar9 < 0x100) * auVar11[1] - (0xff < uVar9);
    dst_argb[1] = (uVar12 != 0) * (uVar12 < 0x100) * auVar11[3] - (0xff < uVar12);
    dst_argb[2] = (uVar13 != 0) * (uVar13 < 0x100) * auVar11[5] - (0xff < uVar13);
    dst_argb[3] = (uVar14 != 0) * (uVar14 < 0x100) * auVar11[7] - (0xff < uVar14) | bVar2;
    dst_argb[4] = (uVar15 != 0) * (uVar15 < 0x100) * auVar11[9] - (0xff < uVar15);
    dst_argb[5] = (uVar16 != 0) * (uVar16 < 0x100) * auVar11[0xb] - (0xff < uVar16);
    dst_argb[6] = (uVar17 != 0) * (uVar17 < 0x100) * auVar11[0xd] - (0xff < uVar17);
    dst_argb[7] = (uVar18 != 0) * (uVar18 < 0x100) * auVar11[0xf] - (0xff < uVar18) | bVar3;
    dst_argb[8] = (uVar19 != 0) * (uVar19 < 0x100) * auVar10[1] - (0xff < uVar19);
    dst_argb[9] = (uVar28 != 0) * (uVar28 < 0x100) * auVar10[3] - (0xff < uVar28);
    dst_argb[10] = (uVar29 != 0) * (uVar29 < 0x100) * auVar10[5] - (0xff < uVar29);
    dst_argb[0xb] = (uVar30 != 0) * (uVar30 < 0x100) * auVar10[7] - (0xff < uVar30) | bVar4;
    dst_argb[0xc] = (uVar31 != 0) * (uVar31 < 0x100) * auVar10[9] - (0xff < uVar31);
    dst_argb[0xd] = (uVar32 != 0) * (uVar32 < 0x100) * auVar10[0xb] - (0xff < uVar32);
    dst_argb[0xe] = (uVar33 != 0) * (uVar33 < 0x100) * auVar10[0xd] - (0xff < uVar33);
    dst_argb[0xf] = (uVar34 != 0) * (uVar34 < 0x100) * auVar10[0xf] - (0xff < uVar34) | bVar5;
    dst_argb = dst_argb + 0x10;
    iVar8 = width + -4;
    bVar1 = 3 < width;
    width = iVar8;
  } while (iVar8 != 0 && bVar1);
  return;
}

Assistant:

void ARGBAttenuateRow_SSSE3(const uint8_t* src_argb,
                            uint8_t* dst_argb,
                            int width) {
  asm volatile(
      "pcmpeqb     %%xmm3,%%xmm3                 \n"
      "pslld       $0x18,%%xmm3                  \n"
      "movdqa      %3,%%xmm4                     \n"
      "movdqa      %4,%%xmm5                     \n"

      // 4 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "pshufb      %%xmm4,%%xmm0                 \n"
      "movdqu      (%0),%%xmm1                   \n"
      "punpcklbw   %%xmm1,%%xmm1                 \n"
      "pmulhuw     %%xmm1,%%xmm0                 \n"
      "movdqu      (%0),%%xmm1                   \n"
      "pshufb      %%xmm5,%%xmm1                 \n"
      "movdqu      (%0),%%xmm2                   \n"
      "punpckhbw   %%xmm2,%%xmm2                 \n"
      "pmulhuw     %%xmm2,%%xmm1                 \n"
      "movdqu      (%0),%%xmm2                   \n"
      "lea         0x10(%0),%0                   \n"
      "pand        %%xmm3,%%xmm2                 \n"
      "psrlw       $0x8,%%xmm0                   \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "por         %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),       // %0
        "+r"(dst_argb),       // %1
        "+r"(width)           // %2
      : "m"(kShuffleAlpha0),  // %3
        "m"(kShuffleAlpha1)   // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}